

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_map.cpp
# Opt level: O2

void __thiscall
CRenderTools::RenderTilemap
          (CRenderTools *this,CTile *pTiles,int w,int h,float Scale,vec4 Color,int RenderFlags,
          ENVELOPE_EVAL pfnEval,void *pUser,int ColorEnv,int ColorEnvOffset)

{
  byte bVar1;
  long lVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int x;
  uint uVar9;
  long in_FS_OFFSET;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  float local_bc;
  float local_88;
  float fStack_84;
  anon_union_4_2_94730039_for_vector4_base<float>_5 local_78;
  anon_union_4_2_94730017_for_vector4_base<float>_7 aStack_74;
  anon_union_4_2_94730227_for_vector4_base<float>_1 local_68;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 aStack_64;
  float ScreenY1;
  float ScreenX1;
  float ScreenY0;
  float ScreenX0;
  float aChannels [4];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[6])
            (this->m_pGraphics,&ScreenX0,&ScreenY0,&ScreenX1,&ScreenY1);
  if (ColorEnv < 0) {
    local_88 = 1.0;
    fStack_84 = 1.0;
    fVar3 = 1.0;
    local_bc = 1.0;
  }
  else {
    (*pfnEval)((float)ColorEnvOffset / 1000.0,ColorEnv,aChannels,pUser);
    local_bc = aChannels[0];
    local_88 = aChannels[2];
    fStack_84 = aChannels[3];
    fVar3 = aChannels[1];
  }
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  local_68 = Color.field_0;
  aStack_64 = Color.field_1;
  local_78 = Color.field_2;
  aStack_74 = Color.field_3;
  fStack_84 = fStack_84 * aStack_74.w;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (local_bc * local_68.x * fStack_84,aStack_64.y * fVar3 * fStack_84,
             fStack_84 * local_88 * local_78.z);
  uVar7 = (int)(ScreenY0 / Scale) - 1;
  do {
    if ((int)(ScreenY1 / Scale) < (int)uVar7) {
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
      __stack_chk_fail();
    }
    uVar8 = 0;
    if (0 < (int)uVar7) {
      uVar8 = uVar7;
    }
    if (h <= (int)uVar8) {
      uVar8 = h - 1;
    }
    for (uVar9 = (int)(ScreenX0 / Scale) - 1; (int)uVar9 <= (int)(ScreenX1 / Scale);
        uVar9 = uVar9 + 1) {
      if ((RenderFlags & 4U) == 0) {
        if ((((int)uVar7 < h) && ((int)uVar9 < w)) &&
           (uVar5 = uVar7, uVar4 = uVar9, -1 < (int)(uVar9 | uVar7))) goto LAB_0017dbe5;
      }
      else {
        uVar4 = 0;
        if (0 < (int)uVar9) {
          uVar4 = uVar9;
        }
        uVar5 = uVar8;
        if (w <= (int)uVar4) {
          uVar4 = w - 1;
        }
LAB_0017dbe5:
        iVar6 = uVar5 * w + uVar4;
        if (pTiles[iVar6].m_Index != '\0') {
          bVar1 = pTiles[iVar6].m_Flags;
          if ((fStack_84 <= 0.99607843) || ((bVar1 & 4) == 0)) {
            uVar4 = RenderFlags & 2;
          }
          else {
            uVar4 = RenderFlags & 1;
          }
          if (uVar4 != 0) {
            uVar16 = 0;
            uVar14 = 0x3f800000;
            uVar10 = 0;
            if ((bVar1 & 1) != 0) {
              uVar14 = 0;
              uVar10 = 0x3f800000;
            }
            if ((bVar1 & 2) == 0) {
              uVar13 = 0;
              uVar16 = 0x3f800000;
            }
            else {
              uVar13 = 0x3f800000;
            }
            uVar11 = uVar13;
            uVar12 = uVar14;
            uVar15 = uVar10;
            if ((bVar1 & 8) != 0) {
              uVar11 = uVar16;
              uVar12 = uVar10;
              uVar16 = uVar13;
              uVar15 = uVar14;
            }
            (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1b])
                      (uVar10,uVar11,uVar12,uVar13,uVar14,uVar16,uVar15);
            aChannels[0] = (float)(int)uVar9 * Scale;
            aChannels[1] = (float)(int)uVar7 * Scale;
            aChannels[2] = Scale;
            aChannels[3] = Scale;
            (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])
                      (this->m_pGraphics,aChannels,1);
          }
        }
        uVar9 = uVar9 + pTiles[iVar6].m_Skip;
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void CRenderTools::RenderTilemap(const CTile *pTiles, int w, int h, float Scale, vec4 Color, int RenderFlags,
									ENVELOPE_EVAL pfnEval, void *pUser, int ColorEnv, int ColorEnvOffset)
{
	float ScreenX0, ScreenY0, ScreenX1, ScreenY1;
	Graphics()->GetScreen(&ScreenX0, &ScreenY0, &ScreenX1, &ScreenY1);

	float r=1, g=1, b=1, a=1;
	if(ColorEnv >= 0)
	{
		float aChannels[4];
		pfnEval(ColorEnvOffset/1000.0f, ColorEnv, aChannels, pUser);
		r = aChannels[0];
		g = aChannels[1];
		b = aChannels[2];
		a = aChannels[3];
	}

	Graphics()->QuadsBegin();
	const float Alpha = Color.a*a;
	Graphics()->SetColor(Color.r*r*Alpha, Color.g*g*Alpha, Color.b*b*Alpha, Alpha);

	int StartY = (int)(ScreenY0/Scale)-1;
	int StartX = (int)(ScreenX0/Scale)-1;
	int EndY = (int)(ScreenY1/Scale)+1;
	int EndX = (int)(ScreenX1/Scale)+1;

	for(int y = StartY; y < EndY; y++)
		for(int x = StartX; x < EndX; x++)
		{
			int mx = x;
			int my = y;

			if(RenderFlags&TILERENDERFLAG_EXTEND)
			{
				if(mx<0)
					mx = 0;
				if(mx>=w)
					mx = w-1;
				if(my<0)
					my = 0;
				if(my>=h)
					my = h-1;
			}
			else
			{
				if(mx<0)
					continue; // mx = 0;
				if(mx>=w)
					continue; // mx = w-1;
				if(my<0)
					continue; // my = 0;
				if(my>=h)
					continue; // my = h-1;
			}

			int c = mx + my*w;

			unsigned char Index = pTiles[c].m_Index;
			if(Index)
			{
				unsigned char Flags = pTiles[c].m_Flags;

				bool Render = false;
				if(Flags&TILEFLAG_OPAQUE && Color.a*a > 254.0f/255.0f)
				{
					if(RenderFlags&LAYERRENDERFLAG_OPAQUE)
						Render = true;
				}
				else
				{
					if(RenderFlags&LAYERRENDERFLAG_TRANSPARENT)
						Render = true;
				}

				if(Render)
				{
					float x0 = 0;
					float y0 = 0;
					float x1 = 1;
					float y1 = 0;
					float x2 = 1;
					float y2 = 1;
					float x3 = 0;
					float y3 = 1;

					if(Flags&TILEFLAG_VFLIP)
					{
						x0 = x2;
						x1 = x3;
						x2 = x3;
						x3 = x0;
					}

					if(Flags&TILEFLAG_HFLIP)
					{
						y0 = y3;
						y2 = y1;
						y3 = y1;
						y1 = y0;
					}

					if(Flags&TILEFLAG_ROTATE)
					{
						float Tmp = x0;
						x0 = x3;
						x3 = x2;
						x2 = x1;
						x1 = Tmp;
						Tmp = y0;
						y0 = y3;
						y3 = y2;
						y2 = y1;
						y1 = Tmp;
					}

					Graphics()->QuadsSetSubsetFree(x0, y0, x1, y1, x2, y2, x3, y3, Index);
					IGraphics::CQuadItem QuadItem(x*Scale, y*Scale, Scale, Scale);
					Graphics()->QuadsDrawTL(&QuadItem, 1);
				}
			}
			x += pTiles[c].m_Skip;
		}

	Graphics()->QuadsEnd();
}